

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O2

void __thiscall fmt::v7::detail::bigint::remove_leading_zeros(bigint *this)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  uint uVar4;
  uint *puVar5;
  
  uVar3 = (this->bigits_).super_buffer<unsigned_int>.size_;
  uVar1 = 1;
  if ((int)(uint)uVar3 < 1) {
    uVar1 = (uint)uVar3;
  }
  puVar5 = (this->bigits_).super_buffer<unsigned_int>.ptr_ + (uVar3 & 0xffffffff);
  do {
    puVar5 = puVar5 + -1;
    uVar2 = (uint)uVar3;
    uVar4 = uVar1;
    if ((int)uVar2 < 2) break;
    uVar3 = (ulong)(uVar2 - 1);
    uVar4 = uVar2;
  } while (*puVar5 == 0);
  buffer<unsigned_int>::try_resize((buffer<unsigned_int> *)this,(ulong)uVar4);
  return;
}

Assistant:

void remove_leading_zeros() {
    int num_bigits = static_cast<int>(bigits_.size()) - 1;
    while (num_bigits > 0 && (*this)[num_bigits] == 0) --num_bigits;
    bigits_.resize(to_unsigned(num_bigits + 1));
  }